

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

void undobuffersize(int n)

{
  if (undobufferlength < n) {
    if (undobuffer == (char *)0x0) {
      undobufferlength = n + 9;
      undobuffer = (char *)malloc((ulong)(uint)undobufferlength);
    }
    else {
      do {
        undobufferlength = undobufferlength * 2;
      } while (undobufferlength < n);
      undobuffer = (char *)realloc(undobuffer,(ulong)(uint)undobufferlength);
    }
  }
  return;
}

Assistant:

static void undobuffersize(int n) {
  if (n > undobufferlength) {
    if (undobuffer) {
      do {undobufferlength *= 2;} while (undobufferlength < n);
      undobuffer = (char*)realloc(undobuffer, undobufferlength);
    } else {
      undobufferlength = n+9;
      undobuffer = (char*)malloc(undobufferlength);
    }
  }
}